

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O0

Flags * __thiscall
flow::util::Flags::defineFloat
          (Flags *this,string *longOpt,char shortOpt,string *valuePlaceholder,string *helpText,
          optional<float> defaultValue,function<void_(float)> *callback)

{
  bool bVar1;
  float *pfVar2;
  function<void_(float)> local_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  byte local_89;
  string local_88;
  enable_if_t<is_constructible_v<decay_t<basic_string<char>_>,_std::__cxx11::basic_string<char>_>,_optional<decay_t<basic_string<char>_>_>_>
  local_68;
  string *local_40;
  string *helpText_local;
  string *valuePlaceholder_local;
  string *psStack_28;
  char shortOpt_local;
  string *longOpt_local;
  Flags *this_local;
  optional<float> defaultValue_local;
  
  local_40 = helpText;
  helpText_local = valuePlaceholder;
  valuePlaceholder_local._7_1_ = shortOpt;
  psStack_28 = longOpt;
  longOpt_local = (string *)this;
  this_local = (Flags *)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
                        super__Optional_payload_base<float>;
  bVar1 = std::optional<float>::has_value((optional<float> *)&this_local);
  local_89 = 0;
  if (bVar1) {
    pfVar2 = std::optional<float>::operator*((optional<float> *)&this_local);
    std::__cxx11::to_string(&local_88,*pfVar2);
    local_89 = 1;
    std::make_optional<std::__cxx11::string>(&local_68,&local_88);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_68);
  }
  std::function<void_(float)>::function(&local_d0,callback);
  std::function<void(std::__cxx11::string_const&)>::
  function<flow::util::Flags::defineFloat(std::__cxx11::string_const&,char,std::__cxx11::string_const&,std::__cxx11::string_const&,std::optional<float>,std::function<void(float)>)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_b0,
             (anon_class_32_1_dda845c3 *)&local_d0);
  defaultValue_local.super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float> =
       (_Optional_base<float,_true,_true>)
       define(this,longOpt,shortOpt,false,Float,valuePlaceholder,helpText,&local_68,&local_b0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b0);
  defineFloat(std::__cxx11::string_const&,char,std::__cxx11::string_const&,std::__cxx11::string_const&,std::optional<float>,std::function<void(float)>)
  ::$_0::~__0((__0 *)&local_d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_68);
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  return (Flags *)(_Optional_payload<float,_true,_true,_true>)
                  defaultValue_local.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>;
}

Assistant:

Flags& Flags::defineFloat(
    const std::string& longOpt,
    char shortOpt,
    const std::string& valuePlaceholder,
    const std::string& helpText,
    std::optional<float> defaultValue,
    std::function<void(float)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Float, valuePlaceholder,
      helpText, defaultValue.has_value() ? std::make_optional(std::to_string(*defaultValue))
                                         : std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(std::stof(value));
        }
      });
}